

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseCommandList(WastParser *this,Script *script,CommandPtrVector *commands)

{
  Result RVar1;
  tuple<wabt::Command_*,_std::default_delete<wabt::Command>_> in_RAX;
  TokenTypePair TVar2;
  pointer *__ptr;
  bool bVar3;
  __uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_> local_38;
  
  local_38._M_t.super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
  super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl =
       (tuple<wabt::Command_*,_std::default_delete<wabt::Command>_>)
       (tuple<wabt::Command_*,_std::default_delete<wabt::Command>_>)
       in_RAX.super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
       super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
  do {
    TVar2 = PeekPair(this);
    if (TVar2._M_elems[0] != Lpar) {
      return (Result)Ok;
    }
    if (Register < TVar2._M_elems[1]) {
      return (Result)Ok;
    }
    if ((0x4846400fcU >> ((ulong)TVar2._M_elems >> 0x20 & 0x3f) & 1) == 0) {
      return (Result)Ok;
    }
    local_38._M_t.super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
    super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl =
         (tuple<wabt::Command_*,_std::default_delete<wabt::Command>_>)
         (_Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>)0x0;
    RVar1 = ParseCommand(this,script,(CommandPtr *)&local_38);
    if (RVar1.enum_ == Ok) {
      std::
      vector<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>,std::allocator<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>>>
      ::emplace_back<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>>
                ((vector<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>,std::allocator<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>>>
                  *)commands,
                 (unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_> *)&local_38);
      bVar3 = true;
    }
    else {
      RVar1 = Synchronize(this,anon_unknown_1::IsCommand);
      bVar3 = RVar1.enum_ != Error;
    }
    if (local_38._M_t.super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
        super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>)0x0) {
      (**(code **)(*(long *)local_38._M_t.
                            super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>
                            .super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl + 8))();
    }
  } while (bVar3);
  return (Result)Error;
}

Assistant:

Result WastParser::ParseCommandList(Script* script,
                                    CommandPtrVector* commands) {
  WABT_TRACE(ParseCommandList);
  while (IsCommand(PeekPair())) {
    CommandPtr command;
    if (Succeeded(ParseCommand(script, &command))) {
      commands->push_back(std::move(command));
    } else {
      CHECK_RESULT(Synchronize(IsCommand));
    }
  }
  return Result::Ok;
}